

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O2

void __thiscall
s2builderutil::S2PolygonLayer::Init
          (S2PolygonLayer *this,S2Polygon *polygon,LabelSetIds *label_set_ids,
          IdSetLexicon *label_set_lexicon,Options *options)

{
  bool bVar1;
  S2LogMessage SStack_18;
  
  if ((label_set_ids == (LabelSetIds *)0x0) != (label_set_lexicon == (IdSetLexicon *)0x0)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_s2polygon_layer.cc"
               ,0x39,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,
                    "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) ");
    abort();
  }
  this->polygon_ = polygon;
  this->label_set_ids_ = label_set_ids;
  this->label_set_lexicon_ = label_set_lexicon;
  (this->options_).edge_type_ = options->edge_type_;
  bVar1 = options->validate_;
  (this->options_).validate_ = bVar1;
  if ((bVar1 & 1U) != 0) {
    S2Polygon::set_s2debug_override(polygon,DISABLE);
    return;
  }
  return;
}

Assistant:

void S2PolygonLayer::Init(
    S2Polygon* polygon, LabelSetIds* label_set_ids,
    IdSetLexicon* label_set_lexicon, const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polygon_ = polygon;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;

  if (options_.validate()) {
    polygon_->set_s2debug_override(S2Debug::DISABLE);
  }
}